

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rm_filehandle.cc
# Opt level: O1

RC __thiscall
RM_FileHandle::GetPageNumAndSlot(RM_FileHandle *this,RID *rid,PageNum *page,SlotNum *slot)

{
  RC RVar1;
  
  RVar1 = RID::isValidRID(rid);
  if (RVar1 == 0) {
    RVar1 = RID::GetPageNum(rid,page);
    if (RVar1 == 0) {
      RVar1 = RID::GetSlotNum(rid,slot);
      return RVar1;
    }
  }
  return RVar1;
}

Assistant:

RC RM_FileHandle::GetPageNumAndSlot(const RID &rid, PageNum &page, SlotNum &slot) const {
  RC rc;
  if((rc = rid.isValidRID()))
    return (rc);  
  if((rc = rid.GetPageNum(page)))
    return (rc);
  if((rc = rid.GetSlotNum(slot)))
    return (rc);
  return (0);
}